

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O3

void __thiscall leveldb::MemTableIterator::Seek(MemTableIterator *this,Slice *k)

{
  Node *pNVar1;
  pointer local_20;
  
  (this->tmp_)._M_string_length = 0;
  *(this->tmp_)._M_dataplus._M_p = '\0';
  PutVarint32(&this->tmp_,(uint32_t)k->size_);
  std::__cxx11::string::append((char *)&this->tmp_,(ulong)k->data_);
  local_20 = (this->tmp_)._M_dataplus._M_p;
  pNVar1 = SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindGreaterOrEqual
                     ((this->iter_).list_,&local_20,(Node **)0x0);
  (this->iter_).node_ = pNVar1;
  return;
}

Assistant:

void Seek(const Slice& k) override { iter_.Seek(EncodeKey(&tmp_, k)); }